

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void input_binary(_Bool *target,size_t length,char *prompt)

{
  _Bool *p_Var1;
  char *pcVar2;
  ulong uVar3;
  _Bool _Var4;
  char input [1024];
  char local_438 [1032];
  
LAB_001012af:
  printf("%s",prompt);
  pcVar2 = fgets(local_438,(int)length + 2,_stdin);
  if (pcVar2 == (char *)0x0) {
    exit(1);
  }
  if (length == 0) {
    return;
  }
  uVar3 = 0;
  p_Var1 = target + length;
  do {
    p_Var1 = p_Var1 + -1;
    if (local_438[uVar3] == '0') {
      _Var4 = false;
    }
    else {
      if (local_438[uVar3] != '1') goto LAB_001012af;
      _Var4 = true;
    }
    *p_Var1 = _Var4;
    uVar3 = uVar3 + 1;
    if (length <= uVar3) {
      return;
    }
  } while( true );
}

Assistant:

void input_binary(bool* target, const size_t length, const char* prompt) {
  char input[1024]; // should be plenty enough

  bool is_valid = false;
  while (!is_valid) {
    printf("%s", prompt);
    if (!fgets(input, (int)(length + 2), stdin)) exit(1);

    is_valid = true;

    for (size_t n = 0; n < length && is_valid; n++) {
      if (input[n] == '0') target[length - n - 1] = false;
      else if (input[n] == '1') target[length - n - 1] = true;
      else is_valid = false;
    }
  }
}